

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PPrintText(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  byte bVar1;
  tmbstr ptVar2;
  Node *node_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ushort **ppuVar8;
  uint mode_00;
  uint uVar9;
  uint c;
  uint local_44;
  uint local_40;
  uint local_3c;
  Node *local_38;
  
  uVar4 = node->start;
  uVar5 = node->end;
  local_44 = 0;
  local_40 = mode;
  local_3c = TextEndsWithNewline(doc->lexer,node,mode);
  local_38 = node;
  uVar3 = TextStartsWithWhitespace(doc->lexer,node,uVar4,local_40);
  node_00 = local_38;
  uVar9 = 0;
  if (0 < (int)local_3c) {
    uVar9 = local_3c;
  }
  uVar9 = uVar5 - uVar9;
  uVar5 = uVar4;
  if (0 < (int)uVar3) {
    if (indent <= uVar3) {
      uVar3 = indent;
    }
    uVar5 = uVar3 + uVar4;
    if (uVar9 <= uVar3 + uVar4) {
      uVar5 = uVar9;
    }
  }
  if (uVar5 < uVar9) {
    local_3c = local_40 | 0x10;
    do {
      CheckWrapIndent(doc,indent);
      ptVar2 = doc->lexer->lexbuf;
      bVar1 = ptVar2[uVar5];
      local_44 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar4 = prvTidyGetUTF8(ptVar2 + uVar5,&local_44);
        uVar5 = uVar4 + uVar5;
      }
      uVar3 = uVar5;
      if (local_44 == 0x26) {
        iVar7 = prvTidyHTMLVersion(doc);
        if (iVar7 == 0x20000) {
          uVar6 = uVar5 + 1;
          mode_00 = local_3c;
          if ((uVar6 != uVar9) &&
             ((uVar9 <= uVar6 ||
              (ppuVar8 = __ctype_b_loc(), mode_00 = local_3c,
              (*(byte *)((long)*ppuVar8 + (ulong)(byte)doc->lexer->lexbuf[uVar6] * 2 + 1) & 0x20) ==
              0)))) goto LAB_0014ccf9;
        }
        else {
LAB_0014ccf9:
          mode_00 = local_40;
        }
        PPrintChar(doc,local_44,mode_00);
      }
      else {
        if (local_44 != 10) goto LAB_0014ccf9;
        prvTidyPFlushLine(doc,indent);
        uVar6 = TextStartsWithWhitespace(doc->lexer,node_00,uVar5 + 1,local_40);
        if (0 < (int)uVar6) {
          if (indent <= uVar6) {
            uVar6 = indent;
          }
          uVar3 = uVar6 + uVar5;
          if (uVar9 <= uVar6 + uVar5) {
            uVar3 = uVar9;
          }
        }
      }
      uVar5 = uVar3 + 1;
    } while (uVar5 < uVar9);
  }
  return;
}

Assistant:

static void PPrintText( TidyDocImpl* doc, uint mode, uint indent,
                        Node* node  )
{
    uint start = node->start;
    uint end = node->end;
    uint ix, c = 0;
    int  ixNL = TextEndsWithNewline( doc->lexer, node, mode );
    int  ixWS = TextStartsWithWhitespace( doc->lexer, node, start, mode );
    if ( ixNL > 0 )
      end -= ixNL;
    start = IncrWS( start, end, indent, ixWS );

    for ( ix = start; ix < end; ++ix )
    {
        CheckWrapIndent( doc, indent );
        /*
        if ( CheckWrapIndent(doc, indent) )
        {
            ixWS = TextStartsWithWhitespace( doc->lexer, node, ix );
            ix = IncrWS( ix, end, indent, ixWS );
        }
        */
        c = (byte) doc->lexer->lexbuf[ix];

        /* look for UTF-8 multibyte character */
        if ( c > 0x7F )
             ix += TY_(GetUTF8)( doc->lexer->lexbuf + ix, &c );

        if ( c == '\n' )
        {
            TY_(PFlushLine)( doc, indent );
            ixWS = TextStartsWithWhitespace( doc->lexer, node, ix+1, mode );
            ix = IncrWS( ix, end, indent, ixWS );
        }
        else if (( c == '&' ) && (TY_(HTMLVersion)(doc) == HT50) &&
            (((ix + 1) == end) || (((ix + 1) < end) && (isspace(doc->lexer->lexbuf[ix+1] & 0xff)))) )
        {
            /*\
             * Issue #207 - This is an unambiguous ampersand need not be 'quoted' in HTML5
             * Issue #379 - Ensure only 0 to 255 passed to 'isspace' to avoid debug assert
            \*/
            PPrintChar( doc, c, (mode | CDATA) );
        }
        else
        {
            PPrintChar( doc, c, mode );
        }
    }
}